

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

char * __thiscall
CVmDateLocale::index_list(CVmDateLocale *this,size_t *itemlen,int item,int idx,int sticky)

{
  char *pcVar1;
  int in_ECX;
  long lVar2;
  long *in_RSI;
  int in_R8D;
  bool bVar3;
  char *p;
  char *comma;
  char *str;
  size_t len;
  char *local_48;
  undefined8 in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_20;
  char *local_8;
  
  local_8 = get((CVmDateLocale *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_20 = in_ECX;
  if (local_8 == (char *)0x0) {
    *in_RSI = 0;
    local_8 = (char *)0x0;
  }
  else {
    for (; 0 < local_20 && in_stack_ffffffffffffffd0 != (size_t *)0x0; local_20 = local_20 + -1) {
      pcVar1 = lib_strnchr(local_8,(size_t)in_stack_ffffffffffffffd0,0x2c);
      if (pcVar1 == (char *)0x0) {
        if (in_R8D == 0) {
          *in_RSI = 0;
          return (char *)0x0;
        }
        break;
      }
      lVar2 = (long)pcVar1 - (long)local_8;
      local_8 = pcVar1 + 1;
      in_stack_ffffffffffffffd0 = (size_t *)((long)in_stack_ffffffffffffffd0 + (-1 - lVar2));
    }
    *in_RSI = 0;
    local_48 = local_8;
    while( true ) {
      bVar3 = false;
      if ((in_stack_ffffffffffffffd0 != (size_t *)0x0) && (bVar3 = false, *local_48 != '=')) {
        bVar3 = *local_48 != ',';
      }
      if (!bVar3) break;
      in_stack_ffffffffffffffd0 = (size_t *)((long)in_stack_ffffffffffffffd0 + -1);
      local_48 = local_48 + 1;
      *in_RSI = *in_RSI + 1;
    }
  }
  return local_8;
}

Assistant:

const char *index_list(VMG_ size_t &itemlen, int item, int idx, int sticky)
    {
        /* get the item */
        size_t len;
        const char *str = get(vmg_ len, item);

        /* if we didn't find it, return failure */
        if (str == 0)
        {
            itemlen = 0;
            return 0;
        }

        /* skip items (delimited by commas) until we reach the target index */
        for ( ; idx > 0 && len != 0 ; --idx, ++str, --len)
        {
            /* find the next comma */
            const char *comma = lib_strnchr(str, len, ',');
            if (comma == 0)
            {
                /* 
                 *   No more commas, so the index is past the end of the
                 *   list.  If 'sticky' is true, use the last item; otherwise
                 *   return "not found".
                 */
                if (sticky)
                    break;
                else
                {
                    itemlen = 0;
                    return 0;
                }
            }
            
            /* advance to the comma */
            len -= comma - str;
            str = comma;
        }
        
        /* we have the item; measure its length, up to the next '=' or ',' */
        const char *p;
        for (p = str, itemlen = 0 ; len != 0 && *p != '=' && *p != ',' ;
             --len, ++p, ++itemlen) ;
        
        /* return the item pointer */
        return str;
    }